

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetLeaderContentAngleRadians(ON_DimStyle *this,double angle_radians)

{
  if (ABS(angle_radians) <= 6.5973445725385655) {
    if (angle_radians < 0.0) {
      do {
        angle_radians = angle_radians + 6.283185307179586;
      } while (angle_radians < 0.0);
    }
    for (; 6.283185307179586 <= angle_radians; angle_radians = angle_radians + -6.283185307179586) {
    }
    Internal_SetDoubleMember(this,LeaderContentAngle,angle_radians,&this->m_leader_content_angle);
    return;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
             ,0x11c7,"","Invalid angle_radians parameter in ON_DimStyle::SetContentAngle().");
  return;
}

Assistant:

void ON_DimStyle::SetLeaderContentAngleRadians(double angle_radians)
{
  if (!(angle_radians >= -2.1*ON_PI && angle_radians <= 2.1*ON_PI))
  {
    ON_ERROR("Invalid angle_radians parameter in ON_DimStyle::SetContentAngle().");
    return;
  }
  
  // positive value so commpare function will work as expected.
  while (angle_radians < 0.0)
    angle_radians += 2.0*ON_PI;
  while (angle_radians >= 2.0*ON_PI)
    angle_radians -= 2.0*ON_PI;

  Internal_SetDoubleMember(ON_DimStyle::field::LeaderContentAngle, angle_radians, m_leader_content_angle);
}